

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

ion_boolean_t test_predicate(ion_dict_cursor_t *cursor,ion_key_t key)

{
  ion_key_size_t iVar1;
  ion_dictionary_parent_t *piVar2;
  ion_key_t pvVar3;
  char cVar4;
  char cVar5;
  bool local_41;
  ion_boolean_t comp_upper;
  ion_boolean_t comp_lower;
  ion_key_t upper_b;
  ion_key_t lower_b;
  ion_boolean_t result;
  ion_key_size_t key_size;
  ion_dictionary_parent_t *parent;
  ion_key_t key_local;
  ion_dict_cursor_t *cursor_local;
  
  piVar2 = cursor->dictionary->instance;
  iVar1 = (cursor->dictionary->instance->record).key_size;
  lower_b._3_1_ = false;
  cVar4 = cursor->predicate->type;
  if (cVar4 == '\0') {
    cVar4 = (*piVar2->compare)(key,(cursor->predicate->statement).range.lower_bound,
                               (cursor->dictionary->instance->record).key_size);
    lower_b._3_1_ = cVar4 == '\0';
  }
  else if (cVar4 == '\x01') {
    pvVar3 = (cursor->predicate->statement).range.upper_bound;
    cVar4 = (*piVar2->compare)(key,(cursor->predicate->statement).range.lower_bound,iVar1);
    cVar5 = (*piVar2->compare)(key,pvVar3,iVar1);
    local_41 = -1 < cVar4 && cVar5 < '\x01';
    lower_b._3_1_ = local_41;
  }
  else if (cVar4 == '\x02') {
    lower_b._3_1_ = true;
  }
  return lower_b._3_1_;
}

Assistant:

ion_boolean_t
test_predicate(
	ion_dict_cursor_t	*cursor,
	ion_key_t			key
) {
	ion_dictionary_parent_t *parent		= cursor->dictionary->instance;
	ion_key_size_t			key_size	= cursor->dictionary->instance->record.key_size;
	ion_boolean_t			result		= boolean_false;

	switch (cursor->predicate->type) {
		case predicate_equality: {
			if (parent->compare(key, cursor->predicate->statement.equality.equality_value, cursor->dictionary->instance->record.key_size) == 0) {
				result = boolean_true;
			}

			break;
		}

		case predicate_range: {
			ion_key_t	lower_b			= cursor->predicate->statement.range.lower_bound;
			ion_key_t	upper_b			= cursor->predicate->statement.range.upper_bound;

			/* Check if key >= lower bound */
			ion_boolean_t comp_lower	= parent->compare(key, lower_b, key_size) >= 0;

			/* Check if key <= upper bound */
			ion_boolean_t comp_upper	= parent->compare(key, upper_b, key_size) <= 0;

			result = comp_lower && comp_upper;
			break;
		}

		case predicate_all_records: {
			result = boolean_true;
			break;
		}
	}

	return result;
}